

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

FlagBase * __thiscall args::FlagBase::Match(FlagBase *this,char flag)

{
  bool bVar1;
  ostream *poVar2;
  ExtraError *this_00;
  char in_SIL;
  FlagBase *in_RDI;
  ostringstream problem;
  string *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe18;
  Matcher *in_stack_fffffffffffffe20;
  ostringstream *this_01;
  ostringstream local_190 [383];
  char local_11;
  FlagBase *local_8;
  
  local_11 = in_SIL;
  bVar1 = Matcher::Match(in_stack_fffffffffffffe20,(char)((ulong)in_stack_fffffffffffffe18 >> 0x38))
  ;
  if (bVar1) {
    if ((((in_RDI->super_NamedBase).field_0x51 & 1) != 0) &&
       (((in_RDI->super_NamedBase).super_Base.matched & 1U) != 0)) {
      this_01 = local_190;
      std::__cxx11::ostringstream::ostringstream(this_01);
      poVar2 = std::operator<<((ostream *)this_01,"Flag \'");
      poVar2 = std::operator<<(poVar2,local_11);
      std::operator<<(poVar2,"\' was passed multiple times, but is only allowed to be passed once");
      this_00 = (ExtraError *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      ExtraError::ExtraError(this_00,in_stack_fffffffffffffe08);
      __cxa_throw(this_00,&ExtraError::typeinfo,ExtraError::~ExtraError);
    }
    (in_RDI->super_NamedBase).super_Base.matched = true;
    local_8 = in_RDI;
  }
  else {
    local_8 = (FlagBase *)0x0;
  }
  return local_8;
}

Assistant:

virtual FlagBase *Match(const char flag)
            {
                if (matcher.Match(flag))
                {
                    if (extraError && matched)
                    {
#ifdef ARGS_NOEXCEPT
                        error = Error::Extra;
#else
                        std::ostringstream problem;
                        problem << "Flag '" << flag << "' was passed multiple times, but is only allowed to be passed once";
                        throw ExtraError(problem.str());
#endif
                    }
                    matched = true;
                    return this;
                }
                return nullptr;
            }